

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

string * __thiscall
kratos::PackedSlice::to_string_abi_cxx11_(string *__return_storage_ptr__,PackedSlice *this)

{
  remove_reference_t<const_std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  string_view format_str;
  string local_c8 [32];
  PackedSlice *local_a8;
  PackedSlice *this_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_98;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  string *local_48;
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_a8 = this;
  this_local = (PackedSlice *)__return_storage_ptr__;
  if (this->original_struct_ == (PackedStruct *)0x0) {
    (*(((this->super_VarSlice).parent_var)->super_IRNode)._vptr_IRNode[0x1f])();
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this->def_;
    local_40 = "{0}.{1}";
    local_48 = local_c8;
    local_38 = __return_storage_ptr__;
    fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string_const&,char[8],char>
              (&local_78,(v7 *)0x425d81,(char (*) [8])local_c8,
               (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs,in_R8);
    local_58 = &local_78;
    local_88 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = &local_98;
    local_30 = local_58;
    local_20 = local_58;
    local_10 = local_58;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_58);
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_98.field_1.values_;
    format_str.size_ = local_98.desc_;
    format_str.data_ = (char *)local_88.size_;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)local_88.data_,format_str,args);
    std::__cxx11::string::~string(local_c8);
  }
  else {
    (*(((this->super_VarSlice).parent_var)->super_IRNode)._vptr_IRNode[0x1f])
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PackedSlice::to_string() const {
    if (original_struct_) {
        return parent_var->to_string();
    } else {
        return ::format("{0}.{1}", parent_var->to_string(), def_->name);
    }
}